

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringTransferFunction(khr_df_transfer_e value)

{
  khr_df_transfer_e value_local;
  char *local_8;
  
  if (value == KHR_DF_TRANSFER_UNSPECIFIED) {
    local_8 = "KHR_DF_TRANSFER_UNSPECIFIED";
  }
  else if (value == KHR_DF_TRANSFER_LINEAR) {
    local_8 = "KHR_DF_TRANSFER_LINEAR";
  }
  else if (value == KHR_DF_TRANSFER_SCRGB) {
    local_8 = "KHR_DF_TRANSFER_SRGB";
  }
  else if (value == KHR_DF_TRANSFER_BT2020) {
    local_8 = "KHR_DF_TRANSFER_ITU";
  }
  else if (value == KHR_DF_TRANSFER_NTSC) {
    local_8 = "KHR_DF_TRANSFER_NTSC";
  }
  else if (value == KHR_DF_TRANSFER_SLOG) {
    local_8 = "KHR_DF_TRANSFER_SLOG";
  }
  else if (value == KHR_DF_TRANSFER_SLOG2) {
    local_8 = "KHR_DF_TRANSFER_SLOG2";
  }
  else if (value == KHR_DF_TRANSFER_BT1886) {
    local_8 = "KHR_DF_TRANSFER_BT1886";
  }
  else if (value == KHR_DF_TRANSFER_HLG_OETF) {
    local_8 = "KHR_DF_TRANSFER_HLG_OETF";
  }
  else if (value == KHR_DF_TRANSFER_HLG_EOTF) {
    local_8 = "KHR_DF_TRANSFER_HLG_EOTF";
  }
  else if (value == KHR_DF_TRANSFER_PQ_EOTF) {
    local_8 = "KHR_DF_TRANSFER_PQ_EOTF";
  }
  else if (value == KHR_DF_TRANSFER_PQ_OETF) {
    local_8 = "KHR_DF_TRANSFER_PQ_OETF";
  }
  else if (value == KHR_DF_TRANSFER_DCIP3) {
    local_8 = "KHR_DF_TRANSFER_DCIP3";
  }
  else if (value == KHR_DF_TRANSFER_PAL_OETF) {
    local_8 = "KHR_DF_TRANSFER_PAL_OETF";
  }
  else if (value == KHR_DF_TRANSFER_PAL625_EOTF) {
    local_8 = "KHR_DF_TRANSFER_PAL625_EOTF";
  }
  else if (value == KHR_DF_TRANSFER_ST240) {
    local_8 = "KHR_DF_TRANSFER_ST240";
  }
  else if (value == KHR_DF_TRANSFER_ACESCC) {
    local_8 = "KHR_DF_TRANSFER_ACESCC";
  }
  else if (value == KHR_DF_TRANSFER_ACESCCT) {
    local_8 = "KHR_DF_TRANSFER_ACESCCT";
  }
  else if (value == KHR_DF_TRANSFER_ADOBERGB) {
    local_8 = "KHR_DF_TRANSFER_ADOBERGB";
  }
  else if (value == KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF) {
    local_8 = "KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF";
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* dfdToStringTransferFunction(khr_df_transfer_e value) {
    switch (value) {
    case KHR_DF_TRANSFER_UNSPECIFIED:
        return "KHR_DF_TRANSFER_UNSPECIFIED";
    case KHR_DF_TRANSFER_LINEAR:
        return "KHR_DF_TRANSFER_LINEAR";
    case KHR_DF_TRANSFER_SRGB:
    // case KHR_DF_TRANSFER_SRGB_EOTF:
    // case KHR_DF_TRANSFER_SCRGB:
    // case KHR_DF_TRANSFER_SCRGB_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_SRGB";
    case KHR_DF_TRANSFER_ITU:
    // case KHR_DF_ITU_OETF:
    // case KHR_DF_TRANSFER_BT601:
    // case KHR_DF_TRANSFER_BT601_OETF:
    // case KHR_DF_TRANSFER_BT709:
    // case KHR_DF_TRANSFER_BT709_OETF:
    // case KHR_DF_TRANSFER_BT2020:
    // case KHR_DF_TRANSFER_BT2020_OETF:
    // case KHR_DF_TRANSFER_SMTPE170M:
    // case KHR_DF_TRANSFER_SMTPE170M_OETF:
    // case KHR_DF_TRANSFER_SMTPE170M_EOTF:
    // case KHR_DF_TRANSFER_SMTPE170M: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ITU";
    case KHR_DF_TRANSFER_NTSC:
    // case KHR_DF_TRANSFER_NTSC_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_NTSC";
    case KHR_DF_TRANSFER_SLOG:
    //case KHR_DF_TRANSFER_SLOG_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_SLOG";
    case KHR_DF_TRANSFER_SLOG2:
    // case KHR_DF_TRANSFER_SLOG2_OETF:
       return "KHR_DF_TRANSFER_SLOG2";
    case KHR_DF_TRANSFER_BT1886:
    // case KHR_DF_TRANSFER_BT1886_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_BT1886";
    case KHR_DF_TRANSFER_HLG_OETF:
        return "KHR_DF_TRANSFER_HLG_OETF";
    case KHR_DF_TRANSFER_HLG_EOTF:
        return "KHR_DF_TRANSFER_HLG_EOTF";
    case KHR_DF_TRANSFER_PQ_EOTF:
        return "KHR_DF_TRANSFER_PQ_EOTF";
    case KHR_DF_TRANSFER_PQ_OETF:
        return "KHR_DF_TRANSFER_PQ_OETF";
    case KHR_DF_TRANSFER_DCIP3:
    // case KHR_DF_TRANSFER_DCIP3_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_DCIP3";
    case KHR_DF_TRANSFER_PAL_OETF:
        return "KHR_DF_TRANSFER_PAL_OETF";
    case KHR_DF_TRANSFER_PAL625_EOTF:
        return "KHR_DF_TRANSFER_PAL625_EOTF";
    case KHR_DF_TRANSFER_ST240:
    // case KHR_DF_TRANSFER_ST240_EOTF:
    // case KHR_DF_TRANSFER_ST240_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ST240";
    case KHR_DF_TRANSFER_ACESCC:
    // case KHR_DF_TRANSFER_ACESCC_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ACESCC";
    case KHR_DF_TRANSFER_ACESCCT:
    // case KHR_DF_TRANSFER_ACESCCT_OETF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ACESCCT";
    case KHR_DF_TRANSFER_ADOBERGB:
    // case KHR_DF_TRANSFER_ADOBERGB_EOTF: // Fallthrough, matching values
        return "KHR_DF_TRANSFER_ADOBERGB";
    case KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF:
        return "KHR_DF_TRANSFER_HLG_UNNORMALIZED_OETF";

    case KHR_DF_TRANSFER_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}